

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# combinator.hpp
# Opt level: O1

result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t> *
__thiscall
toml::detail::character<(char)44>::invoke<std::vector<char,std::allocator<char>>>
          (result<toml::detail::region<std::vector<char,_std::allocator<char>_>_>,_toml::detail::none_t>
           *__return_storage_ptr__,character<(char)44> *this,
          location<std::vector<char,_std::allocator<char>_>_> *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  const_iterator f;
  element_type *peVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  size_type sVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  region<std::vector<char,_std::allocator<char>_>_> local_a0;
  region<std::vector<char,_std::allocator<char>_>_> local_58;
  
  f._M_current = *(char **)(this + 0x40);
  if ((f._M_current == *(char **)(*(long *)(this + 8) + 8)) || (*f._M_current != ',')) {
    __return_storage_ptr__->is_ok_ = false;
  }
  else {
    *(ulong *)(this + 0x18) = *(long *)(this + 0x18) + (ulong)(*f._M_current == '\n');
    *(char **)(this + 0x40) = f._M_current + 1;
    region<std::vector<char,_std::allocator<char>_>_>::region
              (&local_58,(location<std::vector<char,_std::allocator<char>_>_> *)this,f,
               (const_iterator)(f._M_current + 1));
    sVar6 = local_58.source_name_._M_string_length;
    _Var5._M_pi = local_58.source_.
                  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi;
    peVar4 = local_58.source_.
             super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    paVar2 = &local_a0.source_name_.field_2;
    local_a0.super_region_base._vptr_region_base = (_func_int **)&PTR__region_00160ab8;
    local_58.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    local_58.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    paVar3 = &local_58.source_name_.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58.source_name_._M_dataplus._M_p == paVar3) {
      local_a0.source_name_.field_2._8_8_ = local_58.source_name_.field_2._8_8_;
      local_a0.source_name_._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_a0.source_name_._M_dataplus._M_p = local_58.source_name_._M_dataplus._M_p;
    }
    local_a0.source_name_.field_2._M_allocated_capacity._1_7_ =
         local_58.source_name_.field_2._M_allocated_capacity._1_7_;
    local_a0.source_name_.field_2._M_local_buf[0] = local_58.source_name_.field_2._M_local_buf[0];
    local_58.source_name_._M_string_length = 0;
    local_58.source_name_.field_2._M_local_buf[0] = '\0';
    local_a0.first_._M_current = local_58.first_._M_current;
    local_a0.last_._M_current = local_58.last_._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).succ.value.super_region_base._vptr_region_base =
         (_func_int **)&PTR__region_00160ab8;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = peVar4;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_a0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (__return_storage_ptr__->field_1).succ.value.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var5._M_pi;
    local_a0.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    paVar1 = &(__return_storage_ptr__->field_1).succ.value.source_name_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)((long)&__return_storage_ptr__->field_1 + 0x18) = paVar1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.source_name_._M_dataplus._M_p == paVar2) {
      paVar1->_M_allocated_capacity = local_a0.source_name_.field_2._M_allocated_capacity;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_1).succ.value.source_name_.field_2 + 8)
           = local_a0.source_name_.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->field_1).succ.value.source_name_._M_dataplus._M_p =
           local_a0.source_name_._M_dataplus._M_p;
      (__return_storage_ptr__->field_1).succ.value.source_name_.field_2._M_allocated_capacity =
           local_a0.source_name_.field_2._M_allocated_capacity;
    }
    (__return_storage_ptr__->field_1).succ.value.source_name_._M_string_length = sVar6;
    local_a0.source_name_._M_string_length = 0;
    local_a0.source_name_.field_2._M_allocated_capacity =
         (ulong)(uint7)local_58.source_name_.field_2._M_allocated_capacity._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.first_._M_current = local_58.first_._M_current;
    (__return_storage_ptr__->field_1).succ.value.last_._M_current = local_58.last_._M_current;
    local_a0.source_name_._M_dataplus._M_p = (pointer)paVar2;
    local_58.source_name_._M_dataplus._M_p = (pointer)paVar3;
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_a0);
    region<std::vector<char,_std::allocator<char>_>_>::~region(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

static result<region<Cont>, none_t>
    invoke(location<Cont>& loc)
    {
        static_assert(std::is_same<char, typename Cont::value_type>::value,
                      "internal error: container::value_type should be `char`.");

        if(loc.iter() == loc.end()) {return none();}
        const auto first = loc.iter();

        const char c = *(loc.iter());
        if(c != target)
        {
            return none();
        }
        loc.advance(); // update location

        return ok(region<Cont>(loc, first, loc.iter()));
    }